

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_abstract_factory(void)

{
  ostream *poVar1;
  long *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48;
  long *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  std::__cxx11::string::string((string *)&local_48,"abstract factory",(allocator *)&local_28);
  print_func_begin(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::make_shared<abstract_factory::BasketballAbstractFactory>();
  local_28 = (long *)local_48._M_dataplus._M_p;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  (**(code **)*local_28)(&local_58);
  (**(code **)(*local_58 + 0x10))(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  (**(code **)(*local_28 + 8))(&local_58);
  (**(code **)(*local_58 + 0x10))(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::make_shared<abstract_factory::FootballAbstractFactory>();
  std::__shared_ptr<abstract_factory::IAbstractFactory,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<abstract_factory::IAbstractFactory,(__gnu_cxx::_Lock_policy)2> *)
             &local_28,
             (__shared_ptr<abstract_factory::FootballAbstractFactory,_(__gnu_cxx::_Lock_policy)2> *)
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  (**(code **)*local_28)(&local_58);
  (**(code **)(*local_58 + 0x10))(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  (**(code **)(*local_28 + 8))(&local_58);
  (**(code **)(*local_58 + 0x10))(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__cxx11::string::string((string *)&local_48,"abstract factory",(allocator *)&local_58);
  print_func_end(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  return;
}

Assistant:

void test_abstract_factory() {
    print_func_begin("abstract factory");
    std::shared_ptr<abstract_factory::IAbstractFactory> abstract_factory =
            std::make_shared<abstract_factory::BasketballAbstractFactory>();
    std::cout << abstract_factory->GetBall()->GetBallName() << std::endl;
    std::cout << abstract_factory->GetCloth()->GetClothName() << std::endl;

    abstract_factory =
            std::make_shared<abstract_factory::FootballAbstractFactory>();
    std::cout << abstract_factory->GetBall()->GetBallName() << std::endl;
    std::cout << abstract_factory->GetCloth()->GetClothName() << std::endl;

    print_func_end("abstract factory");
}